

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

bool __thiscall
jessilib::text_equali::operator()
          (text_equali *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_lhs,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_rhs)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_rhs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_lhs_local;
  text_equali *this_local;
  
  bVar1 = equalsi<char,char>(in_lhs,in_rhs);
  return bVar1;
}

Assistant:

bool operator()(const std::basic_string<LhsCharT>& in_lhs, const std::basic_string<RhsCharT>& in_rhs) const noexcept {
		return equalsi<LhsCharT, RhsCharT>(in_lhs, in_rhs);
	}